

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O3

void bloaty::pe::ParseSections(PeFile *pe,RangeSink *sink)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t n;
  string_view sVar4;
  Section local_78;
  
  if (pe->ok_ == false) {
    __assert_fail("pe.IsOpen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/pe.cc",0xc0
                  ,"void bloaty::pe::ParseSections(const PeFile &, RangeSink *)");
  }
  if (pe->section_count_ != 0) {
    n = 0;
    do {
      sVar4 = PeFile::section_header(pe,n);
      Section::Section(&local_78,sVar4);
      uVar1 = (pe->data_)._M_len;
      uVar2 = (ulong)local_78.header_.SizeOfRawData;
      uVar3 = (ulong)local_78.header_.PointerToRawData;
      if (uVar1 < uVar2 + uVar3) {
        Throw("region out-of-bounds",0x5d);
      }
      uVar1 = uVar1 - uVar3;
      if (uVar2 <= uVar1) {
        uVar1 = uVar2;
      }
      sVar4._M_str = local_78.name._M_dataplus._M_p;
      sVar4._M_len = local_78.name._M_string_length;
      RangeSink::AddRange(sink,"pe_sections",sVar4,(ulong)local_78.header_.VirtualAddress,
                          (ulong)local_78.header_.VirtualSize,
                          (uint64_t)
                          ((pe->data_)._M_str + (uVar3 - (long)(sink->file_->data_)._M_str)),uVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
        operator_delete(local_78.name._M_dataplus._M_p,
                        local_78.name.field_2._M_allocated_capacity + 1);
      }
      n = n + 1;
    } while (n < pe->section_count_);
  }
  return;
}

Assistant:

void ParseSections(const PeFile& pe, RangeSink* sink) {
  assert(pe.IsOpen());
  ForEachSection(pe, [sink, &pe](const Section& section) {
    uint64_t vmaddr = section.virtual_addr();
    uint64_t vmsize = section.virtual_size();
    std::string_view section_data = StrictSubstr(
        pe.entire_file(), section.raw_offset(), section.raw_size());

    sink->AddRange("pe_sections", section.name, vmaddr, vmsize, section_data);
  });
}